

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O1

void prvTidyPushInline(TidyDocImpl *doc,Node *node)

{
  Dict *pDVar1;
  Lexer *pLVar2;
  IStack *pIVar3;
  tmbstr ptVar4;
  AttVal *pAVar5;
  uint uVar6;
  Lexer *lexer;
  
  if (node->implicit != no) {
    return;
  }
  pDVar1 = node->tag;
  if (((pDVar1 != (Dict *)0x0) && ((pDVar1->model & 0x810) == 0x10)) &&
     ((pLVar2 = doc->lexer, node == (Node *)0x0 ||
      ((pDVar1->id != TidyTag_DEL && (pDVar1->id != TidyTag_INS)))))) {
    if ((node == (Node *)0x0 || pDVar1 == (Dict *)0x0) || (pDVar1->id != TidyTag_FONT)) {
      uVar6 = pLVar2->istacksize;
      do {
        uVar6 = uVar6 - 1;
        if ((int)uVar6 < 0) goto LAB_00137f8e;
      } while (pLVar2->istack[uVar6 & 0x7fffffff].tag != pDVar1);
      if (-1 < (int)uVar6) {
        return;
      }
    }
LAB_00137f8e:
    if (pLVar2->istacklength < pLVar2->istacksize + 1) {
      if (pLVar2->istacklength == 0) {
        pLVar2->istacklength = 6;
      }
      uVar6 = pLVar2->istacklength * 2;
      pLVar2->istacklength = uVar6;
      pIVar3 = (IStack *)
               (*doc->allocator->vtbl->realloc)(doc->allocator,pLVar2->istack,(ulong)uVar6 << 5);
      pLVar2->istack = pIVar3;
    }
    pIVar3 = pLVar2->istack;
    uVar6 = pLVar2->istacksize;
    pIVar3[uVar6].tag = node->tag;
    ptVar4 = prvTidytmbstrdup(doc->allocator,node->element);
    pIVar3[uVar6].element = ptVar4;
    pAVar5 = prvTidyDupAttrs(doc,node->attributes);
    pIVar3[uVar6].attributes = pAVar5;
    pLVar2->istacksize = pLVar2->istacksize + 1;
  }
  return;
}

Assistant:

void TY_(PushInline)( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;
    IStack *istack;

    if (node->implicit)
        return;

    if ( !IsNodePushable(node) )
        return;

    if ( !nodeIsFONT(node) && TY_(IsPushed)(doc, node) )
        return;

    /* make sure there is enough space for the stack */
    if (lexer->istacksize + 1 > lexer->istacklength)
    {
        if (lexer->istacklength == 0)
            lexer->istacklength = 6;   /* this is perhaps excessive */

        lexer->istacklength = lexer->istacklength * 2;
        lexer->istack = (IStack *)TidyDocRealloc(doc, lexer->istack,
                            sizeof(IStack)*(lexer->istacklength));
    }

    istack = &(lexer->istack[lexer->istacksize]);
    istack->tag = node->tag;

    istack->element = TY_(tmbstrdup)(doc->allocator, node->element);
    istack->attributes = TY_(DupAttrs)( doc, node->attributes );
    ++(lexer->istacksize);
}